

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
          (tag_t<cfgfile::string_trait_t> *this,string_t *name,bool is_mandatory)

{
  byte in_DL;
  string *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__tag_t_00188250;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(byte *)(in_RDI + 5) = in_DL & 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::vector((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            *)0x124687);
  in_RDI[9] = 0;
  in_RDI[10] = 0xffffffffffffffff;
  in_RDI[0xb] = 0xffffffffffffffff;
  return;
}

Assistant:

explicit tag_t( const typename Trait::string_t & name,
		bool is_mandatory = false )
		:   m_name( name )
		,   m_is_mandatory( is_mandatory )
		,   m_is_defined( false )
		,	m_parent( nullptr )
		,	m_line_number( -1 )
		,	m_column_number( -1 )
	{
	}